

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O2

void test_AString_split_lastCharDelimiter_fn(int _i)

{
  int iVar1;
  ASplittedString *splitted;
  char *pcVar2;
  char *pcVar3;
  char *expr;
  char *pcVar4;
  char *pcVar5;
  char *__s2;
  AString string;
  
  private_ACUtilsTest_AString_constructTestString(&string,"0123456;",8);
  private_ACUtilsTest_AString_reallocFail = 0;
  splitted = AString_split(&string,';',false);
  if (string.capacity == 8) {
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0xa19);
    if (string.buffer == (char *)0x0) {
      pcVar2 = (char *)0x0;
      __s2 = (char *)0x0;
      expr = "Assertion \'_ck_x != NULL\' failed";
      pcVar3 = "Assertion \'%s\' failed: %s == %#x";
      pcVar4 = "(void*) (string).buffer != NULL";
      pcVar5 = "(void*) (string).buffer";
    }
    else {
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0xa19);
      __s2 = string.buffer;
      if (string.buffer == (char *)0x0) {
        pcVar2 = "";
        __s2 = "(null)";
      }
      else {
        iVar1 = strcmp("0123456;",string.buffer);
        if (iVar1 == 0) {
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0xa19);
          if (string.size != 8) {
            __s2 = "strlen(\"0123456;\")";
            expr = "Assertion \'_ck_x == _ck_y\' failed";
            pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
            pcVar4 = "(string).size == strlen(\"0123456;\")";
            pcVar5 = "(string).size";
            pcVar2 = (char *)string.size;
            goto LAB_001513ab;
          }
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0xa19);
          if (splitted == (ASplittedString *)0x0) {
            pcVar2 = (char *)0x0;
            __s2 = (char *)0x0;
            expr = "Assertion \'_ck_x != NULL\' failed";
            pcVar3 = "Assertion \'%s\' failed: %s == %#x";
            pcVar4 = "(void*) splitted != NULL";
            pcVar5 = "(void*) splitted";
            iVar1 = 0xa1a;
            goto LAB_001517c8;
          }
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0xa1a);
          pcVar2 = (char *)private_ACUtils_ADynArray_size(splitted);
          if (pcVar2 != (char *)0x2) {
            __s2 = "2";
            expr = "Assertion \'_ck_x == _ck_y\' failed";
            pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
            pcVar4 = "private_ACUtils_ADynArray_size(splitted) == 2";
            pcVar5 = "private_ACUtils_ADynArray_size(splitted)";
            iVar1 = 0xa1b;
            goto LAB_001517c8;
          }
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0xa1b);
          pcVar2 = (char *)(*splitted->buffer)->capacity;
          if (pcVar2 == (char *)0x8) {
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0xa1c);
            if ((*splitted->buffer)->buffer == (char *)0x0) {
              pcVar2 = (char *)0x0;
              __s2 = (char *)0x0;
              expr = "Assertion \'_ck_x != NULL\' failed";
              pcVar3 = "Assertion \'%s\' failed: %s == %#x";
              pcVar4 = "(void*) (*(splitted->buffer[0])).buffer != NULL";
              pcVar5 = "(void*) (*(splitted->buffer[0])).buffer";
            }
            else {
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0xa1c);
              __s2 = (*splitted->buffer)->buffer;
              if (__s2 == (char *)0x0) {
                pcVar2 = "";
                __s2 = "(null)";
              }
              else {
                iVar1 = strcmp("0123456",__s2);
                if (iVar1 == 0) {
                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0xa1c);
                  pcVar2 = (char *)(*splitted->buffer)->size;
                  if (pcVar2 != (char *)0x7) {
                    __s2 = "strlen(\"0123456\")";
                    expr = "Assertion \'_ck_x == _ck_y\' failed";
                    pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                    pcVar4 = "(*(splitted->buffer[0])).size == strlen(\"0123456\")";
                    pcVar5 = "(*(splitted->buffer[0])).size";
                    goto LAB_00151566;
                  }
                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0xa1c);
                  pcVar2 = (char *)splitted->buffer[1]->capacity;
                  if (pcVar2 == (char *)0x8) {
                    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                ,0xa1d);
                    if (splitted->buffer[1]->buffer == (char *)0x0) {
                      pcVar2 = (char *)0x0;
                      __s2 = (char *)0x0;
                      expr = "Assertion \'_ck_x != NULL\' failed";
                      pcVar3 = "Assertion \'%s\' failed: %s == %#x";
                      pcVar4 = "(void*) (*(splitted->buffer[1])).buffer != NULL";
                      pcVar5 = "(void*) (*(splitted->buffer[1])).buffer";
                    }
                    else {
                      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                  ,0xa1d);
                      __s2 = splitted->buffer[1]->buffer;
                      if (__s2 == (char *)0x0) {
                        __s2 = "(null)";
                        pcVar2 = "";
                      }
                      else {
                        if (*__s2 == '\0') {
                          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                      ,0xa1d);
                          pcVar2 = (char *)splitted->buffer[1]->size;
                          if (pcVar2 != (char *)0x0) {
                            __s2 = "strlen(\"\")";
                            expr = "Assertion \'_ck_x == _ck_y\' failed";
                            pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                            pcVar4 = "(*(splitted->buffer[1])).size == strlen(\"\")";
                            pcVar5 = "(*(splitted->buffer[1])).size";
                            goto LAB_0015168f;
                          }
                          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                      ,0xa1d);
                          AString_freeSplitted(splitted);
                          if (string.capacity == 8) {
                            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                        ,0xa1f);
                            if (string.buffer == (char *)0x0) {
                              pcVar2 = (char *)0x0;
                              __s2 = (char *)0x0;
                              expr = "Assertion \'_ck_x != NULL\' failed";
                              pcVar3 = "Assertion \'%s\' failed: %s == %#x";
                              pcVar4 = "(void*) (string).buffer != NULL";
                              pcVar5 = "(void*) (string).buffer";
                            }
                            else {
                              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                          ,0xa1f);
                              __s2 = string.buffer;
                              if (string.buffer == (char *)0x0) {
                                __s2 = "(null)";
                                pcVar2 = "";
                              }
                              else {
                                iVar1 = strcmp("0123456;",string.buffer);
                                if (iVar1 == 0) {
                                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                              ,0xa1f);
                                  if (string.size == 8) {
                                    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                                ,0xa1f);
                                    if (private_ACUtilsTest_AString_reallocCount ==
                                        private_ACUtilsTest_AString_freeCount) {
                                      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                                  ,0xa20);
                                      (*string.deallocator)(string.buffer);
                                      return;
                                    }
                                    __s2 = "(private_ACUtilsTest_AString_freeCount)";
                                    expr = "Assertion \'_ck_x == _ck_y\' failed";
                                    pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                                    pcVar4 = 
                                    "private_ACUtilsTest_AString_reallocCount == (private_ACUtilsTest_AString_freeCount)"
                                    ;
                                    pcVar5 = "private_ACUtilsTest_AString_reallocCount";
                                    iVar1 = 0xa20;
                                    pcVar2 = (char *)private_ACUtilsTest_AString_reallocCount;
                                    goto LAB_001517c8;
                                  }
                                  __s2 = "strlen(\"0123456;\")";
                                  expr = "Assertion \'_ck_x == _ck_y\' failed";
                                  pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                                  pcVar4 = "(string).size == strlen(\"0123456;\")";
                                  pcVar5 = "(string).size";
                                  pcVar2 = (char *)string.size;
                                  goto LAB_001517c3;
                                }
                                pcVar2 = "\"";
                              }
                              expr = 
                              "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                              ;
                              pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
                              pcVar4 = "(string).buffer == (\"0123456;\")";
                              pcVar5 = "(string).buffer";
                            }
                          }
                          else {
                            __s2 = "(8)";
                            expr = "Assertion \'_ck_x == _ck_y\' failed";
                            pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                            pcVar4 = "(string).capacity == (8)";
                            pcVar5 = "(string).capacity";
                            pcVar2 = (char *)string.capacity;
                          }
LAB_001517c3:
                          iVar1 = 0xa1f;
                          goto LAB_001517c8;
                        }
                        pcVar2 = "\"";
                      }
                      expr = 
                      "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                      ;
                      pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
                      pcVar4 = "(*(splitted->buffer[1])).buffer == (\"\")";
                      pcVar5 = "(*(splitted->buffer[1])).buffer";
                    }
                  }
                  else {
                    __s2 = "(8)";
                    expr = "Assertion \'_ck_x == _ck_y\' failed";
                    pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                    pcVar4 = "(*(splitted->buffer[1])).capacity == (8)";
                    pcVar5 = "(*(splitted->buffer[1])).capacity";
                  }
LAB_0015168f:
                  iVar1 = 0xa1d;
                  goto LAB_001517c8;
                }
                pcVar2 = "\"";
              }
              expr = 
              "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
              ;
              pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
              pcVar4 = "(*(splitted->buffer[0])).buffer == (\"0123456\")";
              pcVar5 = "(*(splitted->buffer[0])).buffer";
            }
          }
          else {
            __s2 = "(8)";
            expr = "Assertion \'_ck_x == _ck_y\' failed";
            pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
            pcVar4 = "(*(splitted->buffer[0])).capacity == (8)";
            pcVar5 = "(*(splitted->buffer[0])).capacity";
          }
LAB_00151566:
          iVar1 = 0xa1c;
          goto LAB_001517c8;
        }
        pcVar2 = "\"";
      }
      expr = 
      "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
      ;
      pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
      pcVar4 = "(string).buffer == (\"0123456;\")";
      pcVar5 = "(string).buffer";
    }
  }
  else {
    __s2 = "(8)";
    expr = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    pcVar4 = "(string).capacity == (8)";
    pcVar5 = "(string).capacity";
    pcVar2 = (char *)string.capacity;
  }
LAB_001513ab:
  iVar1 = 0xa19;
LAB_001517c8:
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,iVar1,expr,pcVar3,pcVar4,pcVar5,pcVar2,__s2);
}

Assistant:

END_TEST
START_TEST(test_AString_split_lastCharDelimiter)
{
    struct AString string = private_ACUtilsTest_AString_constructTestString("0123456;", 8);
    struct ASplittedString *splitted;
    private_ACUtilsTest_AString_setReallocFail(false, 0);
    splitted = AString_split(&string, ';', false);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "0123456;", 8);
    ACUTILSTEST_ASSERT_PTR_NONNULL(splitted);
    ACUTILSTEST_ASSERT_UINT_EQ(ADynArray_size(splitted), 2);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(*ADynArray_get(splitted, 0), "0123456", 8);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(*ADynArray_get(splitted, 1), "", 8);
    AString_freeSplitted(splitted);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "0123456;", 8);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(private_ACUtilsTest_AString_freeCount);
    private_ACUtilsTest_AString_destructTestString(string);
}